

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O2

int HaveGarbageAtTheEnd(FILE *out)

{
  int iVar1;
  undefined8 in_RAX;
  void *pvVar2;
  undefined8 uStack_38;
  char c;
  
  uStack_38 = in_RAX;
  do {
    iVar1 = __isoc99_fscanf(out,"%c",&c);
    if (iVar1 < 0) {
      return 0;
    }
    pvVar2 = memchr(" \t\r\n",(int)c,5);
  } while (pvVar2 != (void *)0x0);
  PrintWithoutBuffering("garbage at the end -- ");
  return 1;
}

Assistant:

int HaveGarbageAtTheEnd(FILE* out) {
    while (1) {
        char c;
        int status = fscanf(out, "%c", &c);
        if (status < 0) {
            return 0;
        }
        if (!strchr(" \t\r\n", c)) {
            PrintWithoutBuffering("garbage at the end -- ");
            return 1;
        }
    }
}